

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_node(FILE *file,REF_BOOL swap_endian,REF_INT version,REF_BOOL twod,REF_NODE ref_node,
             REF_LONG nnode)

{
  undefined1 *puVar1;
  REF_DBL *pRVar2;
  int dest;
  int iVar3;
  REF_BOOL RVar4;
  REF_INT version_00;
  uint uVar5;
  REF_STATUS RVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  undefined8 uVar13;
  FILE *pFVar14;
  char *xp;
  long lVar15;
  long lVar16;
  long lVar17;
  char *pcVar18;
  REF_MPI pRVar19;
  REF_NODE pRVar20;
  REF_DBL *pRVar21;
  REF_DBL dbl;
  REF_INT n;
  REF_INT new_node;
  REF_LONG id;
  REF_DBL local_88;
  uint local_80;
  int local_7c;
  undefined8 local_78;
  REF_BOOL local_6c;
  REF_NODE local_68;
  REF_MPI local_60;
  FILE *local_58;
  REF_NODE local_50;
  REF_BOOL local_48;
  REF_INT local_44;
  long local_40;
  REF_LONG local_38;
  
  pRVar19 = ref_node->ref_mpi;
  local_48 = twod;
  local_44 = version;
  uVar5 = ref_node_initialize_n_global(ref_node,nnode);
  if (uVar5 == 0) {
    local_78 = (void *)((ulong)local_78._4_4_ << 0x20);
    local_6c = swap_endian;
    local_68 = ref_node;
    local_60 = pRVar19;
    local_58 = (FILE *)file;
    local_50 = (REF_NODE)nnode;
    if (pRVar19->id == 0) {
      local_40 = nnode + -1;
      lVar15 = 0;
      while( true ) {
        pRVar19 = local_60;
        pRVar20 = local_68;
        lVar16 = (long)local_60->n;
        lVar12 = nnode - (local_40 / lVar16) * lVar16;
        if (lVar12 < 2) {
          lVar16 = ((local_40 + lVar16) / lVar16) * lVar12 + (1 - lVar12) * (local_40 / lVar16);
        }
        else {
          lVar16 = (local_40 + lVar16) / lVar16;
        }
        if (lVar16 <= lVar15) {
          uVar10 = (ulong)(uint)local_60->n;
          if (local_60->n < 2) {
            return 0;
          }
          local_68 = (REF_NODE)0x1;
          pFVar14 = local_58;
          goto LAB_0021a314;
        }
        uVar5 = ref_node_add(local_68,lVar15,&local_7c);
        pFVar14 = local_58;
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x52,"ref_part_node",(ulong)uVar5,"new_node");
          return uVar5;
        }
        pRVar20->part[local_7c] = pRVar19->id;
        sVar8 = fread(&local_88,8,1,local_58);
        RVar4 = local_6c;
        if (sVar8 != 1) break;
        if (local_6c != 0) {
          local_88 = (REF_DBL)((ulong)local_88 >> 0x38 |
                               ((ulong)local_88 & 0xff000000000000) >> 0x28 |
                               ((ulong)local_88 & 0xff0000000000) >> 0x18 |
                               ((ulong)local_88 & 0xff00000000) >> 8 |
                               ((ulong)local_88 & 0xff000000) << 8 |
                               ((ulong)local_88 & 0xff0000) << 0x18 |
                               ((ulong)local_88 & 0xff00) << 0x28 | (long)local_88 << 0x38);
        }
        pRVar20->real[(long)local_7c * 0xf] = local_88;
        sVar8 = fread(&local_88,8,1,pFVar14);
        version_00 = local_44;
        if (sVar8 != 1) {
          pcVar18 = "y";
          uVar13 = 0x57;
          goto LAB_0021a72b;
        }
        if (RVar4 != 0) {
          local_88 = (REF_DBL)((ulong)local_88 >> 0x38 |
                               ((ulong)local_88 & 0xff000000000000) >> 0x28 |
                               ((ulong)local_88 & 0xff0000000000) >> 0x18 |
                               ((ulong)local_88 & 0xff00000000) >> 8 |
                               ((ulong)local_88 & 0xff000000) << 8 |
                               ((ulong)local_88 & 0xff0000) << 0x18 |
                               ((ulong)local_88 & 0xff00) << 0x28 | (long)local_88 << 0x38);
        }
        pRVar20->real[(long)local_7c * 0xf + 1] = local_88;
        if (local_48 == 0) {
          sVar8 = fread(&local_88,8,1,pFVar14);
          if (sVar8 != 1) {
            pcVar18 = "z";
            uVar13 = 0x5b;
            goto LAB_0021a72b;
          }
          if (RVar4 != 0) {
            local_88 = (REF_DBL)((ulong)local_88 >> 0x38 |
                                 ((ulong)local_88 & 0xff000000000000) >> 0x28 |
                                 ((ulong)local_88 & 0xff0000000000) >> 0x18 |
                                 ((ulong)local_88 & 0xff00000000) >> 8 |
                                 ((ulong)local_88 & 0xff000000) << 8 |
                                 ((ulong)local_88 & 0xff0000) << 0x18 |
                                 ((ulong)local_88 & 0xff00) << 0x28 | (long)local_88 << 0x38);
          }
        }
        else {
          local_88 = 0.0;
        }
        nnode = (REF_LONG)local_50;
        pRVar20->real[(long)local_7c * 0xf + 2] = local_88;
        if ((0 < version_00) &&
           (RVar6 = ref_part_meshb_long((FILE *)pFVar14,version_00,&local_38), RVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x61,"ref_part_node",1,"nnode");
          return 1;
        }
        lVar15 = lVar15 + 1;
      }
      pcVar18 = "x";
      uVar13 = 0x54;
LAB_0021a72b:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar13
             ,"ref_part_node",pcVar18);
      uVar5 = 1;
    }
    else {
      uVar5 = ref_mpi_scatter_recv(pRVar19,&local_80,1,1);
      if (uVar5 == 0) {
        uVar5 = 0;
        if (0 < (int)local_80) {
          iVar7 = local_80 * 3;
          pvVar9 = malloc((ulong)local_80 * 0x18);
          if (pvVar9 == (void *)0x0) {
            uVar13 = 0x82;
LAB_0021a68f:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar13,"ref_part_node","malloc xyz of REF_DBL NULL");
            uVar5 = 2;
          }
          else {
            uVar5 = ref_mpi_scatter_recv(local_60,pvVar9,iVar7,3);
            if (uVar5 == 0) {
              if (0 < (int)local_80) {
                puVar1 = &local_50[-1].field_0x9f;
                pRVar21 = (REF_DBL *)((long)pvVar9 + 0x10);
                lVar15 = 0;
                do {
                  lVar16 = (long)local_60->id;
                  lVar12 = (long)local_60->n;
                  lVar17 = (long)local_50 - ((long)puVar1 / lVar12) * lVar12;
                  if (lVar16 < lVar17) {
                    lVar16 = ((long)(puVar1 + lVar12) / lVar12) * lVar16;
                  }
                  else {
                    lVar16 = ((long)(puVar1 + lVar12) / lVar12) * lVar17 +
                             (lVar16 - lVar17) * ((long)puVar1 / lVar12);
                  }
                  uVar5 = ref_node_add(local_68,lVar16 + lVar15,&local_7c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x89,"ref_part_node",(ulong)uVar5,"new_node");
                    return uVar5;
                  }
                  local_68->part[local_7c] = local_60->id;
                  pRVar2 = local_68->real;
                  lVar16 = (long)local_7c;
                  pRVar2[lVar16 * 0xf] = pRVar21[-2];
                  pRVar2[lVar16 * 0xf + 1] = pRVar21[-1];
                  pRVar2[lVar16 * 0xf + 2] = *pRVar21;
                  lVar15 = lVar15 + 1;
                  pRVar21 = pRVar21 + 3;
                } while (lVar15 < (int)local_80);
              }
              free(pvVar9);
              uVar5 = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x83,"ref_part_node",(ulong)uVar5,"recv");
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x80
               ,"ref_part_node",(ulong)uVar5,"recv");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x4c,
           "ref_part_node",(ulong)uVar5,"init nnodesg");
  }
  return uVar5;
LAB_0021a314:
  pRVar19 = local_60;
  pRVar20 = local_68;
  local_50 = (REF_NODE)((long)&local_68->n + 1);
  lVar15 = (long)(int)uVar10;
  lVar16 = nnode - (local_40 / lVar15) * lVar15;
  iVar3 = (int)lVar16;
  iVar7 = (int)(local_40 / lVar15);
  if ((long)local_50 < lVar16) {
    iVar11 = (int)((local_40 + lVar15) / lVar15) * (int)local_50;
  }
  else {
    iVar11 = (int)((local_40 + lVar15) / lVar15) * iVar3 + ((int)local_50 - iVar3) * iVar7;
  }
  dest = (int)local_68;
  if ((long)local_68 < lVar16) {
    iVar7 = (int)((local_40 + lVar15) / lVar15) * dest;
  }
  else {
    iVar7 = (int)((local_40 + lVar15) / lVar15) * iVar3 + (dest - iVar3) * iVar7;
  }
  local_80 = iVar11 - iVar7;
  uVar5 = ref_mpi_scatter_send(local_60,&local_80,1,1,dest);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x66,
           "ref_part_node",(ulong)uVar5,"send");
    return uVar5;
  }
  if (0 < (int)local_80) {
    pvVar9 = malloc((ulong)local_80 * 0x18);
    if (pvVar9 == (void *)0x0) {
      uVar13 = 0x68;
      goto LAB_0021a68f;
    }
    if (0 < (int)local_80) {
      pRVar21 = (REF_DBL *)((long)pvVar9 + 0x10);
      lVar15 = 0;
      local_78 = pvVar9;
      do {
        sVar8 = fread(&local_88,8,1,pFVar14);
        if (sVar8 != 1) {
          pcVar18 = "x";
          uVar13 = 0x6a;
          goto LAB_0021a72b;
        }
        if (local_6c != 0) {
          local_88 = (REF_DBL)((ulong)local_88 >> 0x38 |
                               ((ulong)local_88 & 0xff000000000000) >> 0x28 |
                               ((ulong)local_88 & 0xff0000000000) >> 0x18 |
                               ((ulong)local_88 & 0xff00000000) >> 8 |
                               ((ulong)local_88 & 0xff000000) << 8 |
                               ((ulong)local_88 & 0xff0000) << 0x18 |
                               ((ulong)local_88 & 0xff00) << 0x28 | (long)local_88 << 0x38);
        }
        pRVar21[-2] = local_88;
        sVar8 = fread(&local_88,8,1,pFVar14);
        if (sVar8 != 1) {
          pcVar18 = "y";
          uVar13 = 0x6d;
          goto LAB_0021a72b;
        }
        if (local_6c != 0) {
          local_88 = (REF_DBL)((ulong)local_88 >> 0x38 |
                               ((ulong)local_88 & 0xff000000000000) >> 0x28 |
                               ((ulong)local_88 & 0xff0000000000) >> 0x18 |
                               ((ulong)local_88 & 0xff00000000) >> 8 |
                               ((ulong)local_88 & 0xff000000) << 8 |
                               ((ulong)local_88 & 0xff0000) << 0x18 |
                               ((ulong)local_88 & 0xff00) << 0x28 | (long)local_88 << 0x38);
        }
        pRVar21[-1] = local_88;
        if (local_48 == 0) {
          sVar8 = fread(&local_88,8,1,pFVar14);
          if (sVar8 != 1) {
            pcVar18 = "z";
            uVar13 = 0x71;
            goto LAB_0021a72b;
          }
          if (local_6c != 0) {
            local_88 = (REF_DBL)((ulong)local_88 >> 0x38 |
                                 ((ulong)local_88 & 0xff000000000000) >> 0x28 |
                                 ((ulong)local_88 & 0xff0000000000) >> 0x18 |
                                 ((ulong)local_88 & 0xff00000000) >> 8 |
                                 ((ulong)local_88 & 0xff000000) << 8 |
                                 ((ulong)local_88 & 0xff0000) << 0x18 |
                                 ((ulong)local_88 & 0xff00) << 0x28 | (long)local_88 << 0x38);
          }
        }
        else {
          local_88 = 0.0;
        }
        *pRVar21 = local_88;
        if ((0 < local_44) &&
           (RVar6 = ref_part_meshb_long((FILE *)local_58,local_44,&local_38), RVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x78,"ref_part_node",1,"nnode");
          return 1;
        }
        lVar15 = lVar15 + 1;
        pRVar21 = pRVar21 + 3;
        pFVar14 = local_58;
        pRVar19 = local_60;
        pRVar20 = local_68;
        pvVar9 = local_78;
      } while (lVar15 < (int)local_80);
    }
    uVar5 = ref_mpi_scatter_send(pRVar19,pvVar9,local_80 * 3,3,(REF_INT)pRVar20);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7b,
             "ref_part_node",(ulong)uVar5,"send");
      return uVar5;
    }
    free(pvVar9);
    pFVar14 = local_58;
  }
  uVar10 = (ulong)pRVar19->n;
  local_68 = local_50;
  if ((long)uVar10 <= (long)local_50) {
    return 0;
  }
  goto LAB_0021a314;
}

Assistant:

REF_FCN static REF_STATUS ref_part_node(FILE *file, REF_BOOL swap_endian,
                                        REF_INT version, REF_BOOL twod,
                                        REF_NODE ref_node, REF_LONG nnode) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT node, new_node;
  REF_INT part;
  REF_INT n;
  REF_LONG id;
  REF_DBL dbl;
  REF_DBL *xyz;

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init nnodesg");

  if (ref_mpi_once(ref_mpi)) {
    part = 0;
    for (node = 0; node < ref_part_first(nnode, ref_mpi_n(ref_mpi), 1);
         node++) {
      RSS(ref_node_add(ref_node, node, &new_node), "new_node");
      ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
      RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "x");
      if (swap_endian) SWAP_DBL(dbl);
      ref_node_xyz(ref_node, 0, new_node) = dbl;
      RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "y");
      if (swap_endian) SWAP_DBL(dbl);
      ref_node_xyz(ref_node, 1, new_node) = dbl;
      if (!twod) {
        RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "z");
        if (swap_endian) SWAP_DBL(dbl);
      } else {
        dbl = 0.0;
      }
      ref_node_xyz(ref_node, 2, new_node) = dbl;
      if (version > 0) RSS(ref_part_meshb_long(file, version, &id), "nnode");
    }
    each_ref_mpi_worker(ref_mpi, part) {
      n = (REF_INT)(ref_part_first(nnode, ref_mpi_n(ref_mpi), part + 1) -
                    ref_part_first(nnode, ref_mpi_n(ref_mpi), part));
      RSS(ref_mpi_scatter_send(ref_mpi, &n, 1, REF_INT_TYPE, part), "send");
      if (n > 0) {
        ref_malloc(xyz, 3 * n, REF_DBL);
        for (node = 0; node < n; node++) {
          RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "x");
          if (swap_endian) SWAP_DBL(dbl);
          xyz[0 + 3 * node] = dbl;
          RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "y");
          if (swap_endian) SWAP_DBL(dbl);
          xyz[1 + 3 * node] = dbl;
          if (!twod) {
            RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "z");
            if (swap_endian) SWAP_DBL(dbl);
          } else {
            dbl = 0.0;
          }
          xyz[2 + 3 * node] = dbl;
          if (version > 0)
            RSS(ref_part_meshb_long(file, version, &id), "nnode");
        }
        RSS(ref_mpi_scatter_send(ref_mpi, xyz, 3 * n, REF_DBL_TYPE, part),
            "send");
        free(xyz);
      }
    }
  } else {
    RSS(ref_mpi_scatter_recv(ref_mpi, &n, 1, REF_INT_TYPE), "recv");
    if (n > 0) {
      ref_malloc(xyz, 3 * n, REF_DBL);
      RSS(ref_mpi_scatter_recv(ref_mpi, xyz, 3 * n, REF_DBL_TYPE), "recv");
      for (node = 0; node < n; node++) {
        RSS(ref_node_add(ref_node,
                         node + ref_part_first(nnode, ref_mpi_n(ref_mpi),
                                               ref_mpi_rank(ref_mpi)),
                         &new_node),
            "new_node");
        ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
        ref_node_xyz(ref_node, 0, new_node) = xyz[0 + 3 * node];
        ref_node_xyz(ref_node, 1, new_node) = xyz[1 + 3 * node];
        ref_node_xyz(ref_node, 2, new_node) = xyz[2 + 3 * node];
      }
      free(xyz);
    }
  }

  return REF_SUCCESS;
}